

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O3

void __thiscall ViewTest::copyConstructorTest(ViewTest *this)

{
  int iVar1;
  undefined8 uVar2;
  bool bVar3;
  reference piVar4;
  reference piVar5;
  reference piVar6;
  reference piVar7;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  logic_error *plVar12;
  code *pcVar13;
  bool bVar14;
  ulong uVar15;
  undefined *puVar16;
  ulong uVar17;
  View<int,_false,_std::allocator<unsigned_long>_> v;
  View<int,_false,_std::allocator<unsigned_long>_> w;
  int local_cc;
  undefined1 local_c8 [16];
  size_t *local_b8;
  size_t *local_b0;
  size_t *local_a8;
  size_t local_a0;
  size_t local_98;
  CoordinateOrder local_90;
  bool local_8c;
  undefined1 local_88 [16];
  unsigned_long *local_78;
  unsigned_long *local_70;
  unsigned_long *local_68;
  size_t local_60;
  size_t local_58;
  CoordinateOrder local_50;
  bool local_4c;
  ulong local_48;
  int *local_40;
  unsigned_long *local_38;
  
  local_c8._0_8_ = this;
  local_b8 = (size_t *)operator_new(0);
  local_a0 = 0;
  local_98 = 1;
  local_90 = LastMajorOrder;
  local_8c = true;
  local_b0 = local_b8;
  local_a8 = local_b8;
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_c8);
  local_88._0_8_ = local_c8._0_8_;
  if (local_a0 == 0) {
    local_60 = 0;
    local_78 = (unsigned_long *)0x0;
  }
  else {
    local_78 = __gnu_cxx::new_allocator<unsigned_long>::allocate
                         ((new_allocator<unsigned_long> *)(local_88 + 8),local_a0 * 3,(void *)0x0);
    local_60 = local_a0;
  }
  local_70 = local_78 + local_60;
  local_68 = local_70 + local_60;
  local_58 = local_98;
  local_50 = local_90;
  local_4c = local_8c;
  memcpy(local_78,local_b8,local_60 * 0x18);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_88);
  if ((ViewTest *)local_88._0_8_ == (ViewTest *)0x0) {
    plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar12,"Assertion failed.");
  }
  else {
    if ((ViewTest *)local_c8._0_8_ != (ViewTest *)0x0) {
      if ((local_60 == local_a0) && (local_58 == local_98)) {
        local_cc = 0;
        piVar4 = andres::marray_detail::AccessOperatorHelper<true>::
                 execute<int,int,false,std::allocator<unsigned_long>>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_88,&local_cc);
        local_cc = 0;
        piVar5 = andres::marray_detail::AccessOperatorHelper<true>::
                 execute<int,int,false,std::allocator<unsigned_long>>
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_c8,&local_cc);
        if (piVar4 == piVar5) {
          operator_delete(local_78,local_60 * 0x18);
          operator_delete(local_b8,local_a0 * 0x18);
          local_c8._0_8_ = this;
          local_b8 = (size_t *)operator_new(0);
          local_a0 = 0;
          local_98 = 1;
          local_90 = LastMajorOrder;
          local_8c = true;
          local_b0 = local_b8;
          local_a8 = local_b8;
          andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_c8);
          local_88._0_8_ = local_c8._0_8_;
          if (local_a0 == 0) {
            local_60 = 0;
            local_78 = (unsigned_long *)0x0;
          }
          else {
            local_78 = __gnu_cxx::new_allocator<unsigned_long>::allocate
                                 ((new_allocator<unsigned_long> *)(local_88 + 8),local_a0 * 3,
                                  (void *)0x0);
            local_60 = local_a0;
          }
          local_70 = local_78 + local_60;
          local_68 = local_70 + local_60;
          local_58 = local_98;
          local_50 = local_90;
          local_4c = local_8c;
          memcpy(local_78,local_b8,local_60 * 0x18);
          andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                    ((View<int,_true,_std::allocator<unsigned_long>_> *)local_88);
          if ((ViewTest *)local_88._0_8_ == (ViewTest *)0x0) {
            plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error((runtime_error *)plVar12,"Assertion failed.");
          }
          else {
            if ((ViewTest *)local_c8._0_8_ != (ViewTest *)0x0) {
              if ((local_60 == local_a0) && (local_58 == local_98)) {
                local_cc = 0;
                piVar6 = andres::marray_detail::AccessOperatorHelper<true>::
                         execute<int,int,true,std::allocator<unsigned_long>>
                                   ((View<int,_true,_std::allocator<unsigned_long>_> *)local_88,
                                    &local_cc);
                local_cc = 0;
                piVar4 = andres::marray_detail::AccessOperatorHelper<true>::
                         execute<int,int,false,std::allocator<unsigned_long>>
                                   ((View<int,_false,_std::allocator<unsigned_long>_> *)local_c8,
                                    &local_cc);
                if (piVar6 == piVar4) {
                  operator_delete(local_78,local_60 * 0x18);
                  operator_delete(local_b8,local_a0 * 0x18);
                  local_c8._0_8_ = this;
                  local_b8 = (size_t *)operator_new(0);
                  local_a0 = 0;
                  local_98 = 1;
                  local_90 = LastMajorOrder;
                  local_8c = true;
                  local_b0 = local_b8;
                  local_a8 = local_b8;
                  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_c8);
                  local_88._0_8_ = local_c8._0_8_;
                  if (local_a0 == 0) {
                    local_60 = 0;
                    local_78 = (unsigned_long *)0x0;
                  }
                  else {
                    local_78 = __gnu_cxx::new_allocator<unsigned_long>::allocate
                                         ((new_allocator<unsigned_long> *)(local_88 + 8),
                                          local_a0 * 3,(void *)0x0);
                    local_60 = local_a0;
                  }
                  local_70 = local_78 + local_60;
                  local_68 = local_70 + local_60;
                  local_58 = local_98;
                  local_50 = local_90;
                  local_4c = local_8c;
                  memcpy(local_78,local_b8,local_60 * 0x18);
                  if ((ViewTest *)local_88._0_8_ == (ViewTest *)0x0) {
                    plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error((runtime_error *)plVar12,"Assertion failed.");
                  }
                  else {
                    if ((ViewTest *)local_c8._0_8_ != (ViewTest *)0x0) {
                      if ((local_60 == local_a0) && (local_58 == local_98)) {
                        local_cc = 0;
                        piVar6 = andres::marray_detail::AccessOperatorHelper<true>::
                                 execute<int,int,true,std::allocator<unsigned_long>>
                                           ((View<int,_true,_std::allocator<unsigned_long>_> *)
                                            local_88,&local_cc);
                        local_cc = 0;
                        piVar7 = andres::marray_detail::AccessOperatorHelper<true>::
                                 execute<int,int,true,std::allocator<unsigned_long>>
                                           ((View<int,_true,_std::allocator<unsigned_long>_> *)
                                            local_c8,&local_cc);
                        if (piVar6 == piVar7) {
                          operator_delete(local_78,local_60 * 0x18);
                          operator_delete(local_b8,local_a0 * 0x18);
                          _Var8._M_current = (unsigned_long *)operator_new(8);
                          *_Var8._M_current = 0x18;
                          local_c8._0_8_ = this->data_;
                          local_40 = (int *)local_c8._0_8_;
                          andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                          Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                    ((Geometry<std::allocator<unsigned_long>> *)(local_c8 + 8),_Var8
                                     ,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                       )(_Var8._M_current + 1),&andres::defaultOrder,
                                     &andres::defaultOrder,(allocator_type *)local_88);
                          andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_c8);
                          local_88._0_8_ = local_c8._0_8_;
                          if (local_a0 == 0) {
                            local_60 = 0;
                            local_78 = (unsigned_long *)0x0;
                          }
                          else {
                            local_78 = __gnu_cxx::new_allocator<unsigned_long>::allocate
                                                 ((new_allocator<unsigned_long> *)(local_88 + 8),
                                                  local_a0 * 3,(void *)0x0);
                            local_60 = local_a0;
                          }
                          local_70 = local_78 + local_60;
                          local_68 = local_70 + local_60;
                          local_58 = local_98;
                          local_50 = local_90;
                          local_4c = local_8c;
                          memcpy(local_78,local_b8,local_60 * 0x18);
                          andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_88);
                          if ((int *)local_88._0_8_ == (int *)0x0) {
                            plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                            std::runtime_error::runtime_error
                                      ((runtime_error *)plVar12,"Assertion failed.");
                          }
                          else {
                            if ((int *)local_c8._0_8_ != (int *)0x0) {
                              if ((local_60 == local_a0) && (local_58 == local_98)) {
                                local_cc = 0;
                                piVar4 = andres::marray_detail::AccessOperatorHelper<true>::
                                         execute<int,int,false,std::allocator<unsigned_long>>
                                                   ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_88,&local_cc);
                                local_cc = 0;
                                piVar5 = andres::marray_detail::AccessOperatorHelper<true>::
                                         execute<int,int,false,std::allocator<unsigned_long>>
                                                   ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8,&local_cc);
                                if (piVar4 == piVar5) {
                                  sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                          shape((View<int,_false,_std::allocator<unsigned_long>_> *)
                                                local_88,0);
                                  sVar10 = andres::View<int,_false,_std::allocator<unsigned_long>_>
                                           ::shape((View<int,_false,_std::allocator<unsigned_long>_>
                                                    *)local_c8,0);
                                  if (sVar9 != sVar10) {
                                    plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                                    std::logic_error::logic_error(plVar12,"test failed.");
                                    __cxa_throw(plVar12,&std::logic_error::typeinfo,
                                                std::logic_error::~logic_error);
                                  }
                                  if (local_98 != 0) {
                                    sVar9 = 0;
                                    do {
                                      piVar4 = andres::
                                               View<int,_false,_std::allocator<unsigned_long>_>::
                                               operator()((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_88,sVar9);
                                      iVar1 = *piVar4;
                                      piVar4 = andres::
                                               View<int,_false,_std::allocator<unsigned_long>_>::
                                               operator()((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8,sVar9);
                                      if (iVar1 != *piVar4) {
                                        plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                                        std::logic_error::logic_error(plVar12,"test failed.");
                                        __cxa_throw(plVar12,&std::logic_error::typeinfo,
                                                    std::logic_error::~logic_error);
                                      }
                                      sVar9 = sVar9 + 1;
                                    } while (sVar9 < local_98);
                                  }
                                  operator_delete(local_78,local_60 * 0x18);
                                  operator_delete(local_b8,local_a0 * 0x18);
                                  operator_delete(_Var8._M_current,8);
                                  _Var8._M_current = (unsigned_long *)operator_new(8);
                                  *_Var8._M_current = 0x18;
                                  local_c8._0_8_ = local_40;
                                  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                            ((Geometry<std::allocator<unsigned_long>> *)
                                             (local_c8 + 8),_Var8,
                                             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                              )(_Var8._M_current + 1),&andres::defaultOrder,
                                             &andres::defaultOrder,(allocator_type *)local_88);
                                  andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                  testInvariant((View<int,_false,_std::allocator<unsigned_long>_> *)
                                                local_c8);
                                  local_88._0_8_ = local_c8._0_8_;
                                  if (local_a0 == 0) {
                                    local_60 = 0;
                                    local_78 = (unsigned_long *)0x0;
                                  }
                                  else {
                                    local_78 = __gnu_cxx::new_allocator<unsigned_long>::allocate
                                                         ((new_allocator<unsigned_long> *)
                                                          (local_88 + 8),local_a0 * 3,(void *)0x0);
                                    local_60 = local_a0;
                                  }
                                  local_70 = local_78 + local_60;
                                  local_68 = local_70 + local_60;
                                  local_58 = local_98;
                                  local_50 = local_90;
                                  local_4c = local_8c;
                                  memcpy(local_78,local_b8,local_60 * 0x18);
                                  andres::View<int,_true,_std::allocator<unsigned_long>_>::
                                  testInvariant((View<int,_true,_std::allocator<unsigned_long>_> *)
                                                local_88);
                                  if ((int *)local_88._0_8_ == (int *)0x0) {
                                    plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                                    std::runtime_error::runtime_error
                                              ((runtime_error *)plVar12,"Assertion failed.");
                                  }
                                  else {
                                    if ((int *)local_c8._0_8_ != (int *)0x0) {
                                      if ((local_60 == local_a0) && (local_58 == local_98)) {
                                        local_cc = 0;
                                        piVar6 = andres::marray_detail::AccessOperatorHelper<true>::
                                                 execute<int,int,true,std::allocator<unsigned_long>>
                                                           ((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_88,&local_cc);
                                        local_cc = 0;
                                        piVar4 = andres::marray_detail::AccessOperatorHelper<true>::
                                                 execute<int,int,false,std::allocator<unsigned_long>>
                                                           ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8,&local_cc);
                                        if (piVar6 == piVar4) {
                                          sVar9 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_88,0);
                                          sVar10 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8,0);
                                          if (sVar9 != sVar10) {
                                            plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                                            std::logic_error::logic_error(plVar12,"test failed.");
                                            __cxa_throw(plVar12,&std::logic_error::typeinfo,
                                                        std::logic_error::~logic_error);
                                          }
                                          if (local_98 != 0) {
                                            sVar9 = 0;
                                            do {
                                              piVar6 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  operator()((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_88,sVar9);
                                              iVar1 = *piVar6;
                                              piVar4 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  operator()((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8,sVar9);
                                              if (iVar1 != *piVar4) {
                                                plVar12 = (logic_error *)
                                                          __cxa_allocate_exception(0x10);
                                                std::logic_error::logic_error
                                                          (plVar12,"test failed.");
                                                __cxa_throw(plVar12,&std::logic_error::typeinfo,
                                                            std::logic_error::~logic_error);
                                              }
                                              sVar9 = sVar9 + 1;
                                            } while (sVar9 < local_98);
                                          }
                                          operator_delete(local_78,local_60 * 0x18);
                                          operator_delete(local_b8,local_a0 * 0x18);
                                          operator_delete(_Var8._M_current,8);
                                          _Var8._M_current = (unsigned_long *)operator_new(8);
                                          *_Var8._M_current = 0x18;
                                          local_c8._0_8_ = local_40;
                                          andres::marray_detail::
                                          Geometry<std::allocator<unsigned_long>>::
                                          Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                    ((Geometry<std::allocator<unsigned_long>> *)
                                                     (local_c8 + 8),_Var8,
                                                     (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var8._M_current + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)local_88);
                                          andres::View<int,_true,_std::allocator<unsigned_long>_>::
                                          testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8);
                                          local_88._0_8_ = local_c8._0_8_;
                                          if (local_a0 == 0) {
                                            local_60 = 0;
                                            local_78 = (unsigned_long *)0x0;
                                          }
                                          else {
                                            local_78 = __gnu_cxx::new_allocator<unsigned_long>::
                                                       allocate((new_allocator<unsigned_long> *)
                                                                (local_88 + 8),local_a0 * 3,
                                                                (void *)0x0);
                                            local_60 = local_a0;
                                          }
                                          local_70 = local_78 + local_60;
                                          local_68 = local_70 + local_60;
                                          local_58 = local_98;
                                          local_50 = local_90;
                                          local_4c = local_8c;
                                          memcpy(local_78,local_b8,local_60 * 0x18);
                                          if ((int *)local_88._0_8_ == (int *)0x0) {
                                            plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                                            std::runtime_error::runtime_error
                                                      ((runtime_error *)plVar12,"Assertion failed.")
                                            ;
                                          }
                                          else {
                                            if ((int *)local_c8._0_8_ != (int *)0x0) {
                                              if ((local_60 == local_a0) && (local_58 == local_98))
                                              {
                                                local_cc = 0;
                                                piVar6 = andres::marray_detail::
                                                         AccessOperatorHelper<true>::
                                                                                                                  
                                                  execute<int,int,true,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_88,&local_cc);
                                                local_cc = 0;
                                                piVar7 = andres::marray_detail::
                                                         AccessOperatorHelper<true>::
                                                                                                                  
                                                  execute<int,int,true,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8,&local_cc);
                                                if (piVar6 == piVar7) {
                                                  sVar9 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_88,0);
                                                  sVar10 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8,0);
                                                  if (sVar9 != sVar10) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar12,"test failed.");
                                                    __cxa_throw(plVar12,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  if (local_98 != 0) {
                                                    sVar9 = 0;
                                                    do {
                                                      piVar6 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  operator()((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_88,sVar9);
                                                  iVar1 = *piVar6;
                                                  piVar6 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  operator()((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8,sVar9);
                                                  if (iVar1 != *piVar6) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar12,"test failed.");
                                                    __cxa_throw(plVar12,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  sVar9 = sVar9 + 1;
                                                  } while (sVar9 < local_98);
                                                  }
                                                  operator_delete(local_78,local_60 * 0x18);
                                                  operator_delete(local_b8,local_a0 * 0x18);
                                                  operator_delete(_Var8._M_current,8);
                                                  _Var8._M_current =
                                                       (unsigned_long *)operator_new(0x10);
                                                  *_Var8._M_current = 6;
                                                  _Var8._M_current[1] = 4;
                                                  local_c8._0_8_ = local_40;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_c8 + 8),_Var8,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var8._M_current + 2),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)local_88);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8);
                                                  local_88._0_8_ = local_c8._0_8_;
                                                  if (local_a0 == 0) {
                                                    local_60 = 0;
                                                    local_78 = (unsigned_long *)0x0;
                                                  }
                                                  else {
                                                    local_78 = __gnu_cxx::
                                                               new_allocator<unsigned_long>::
                                                               allocate((
                                                  new_allocator<unsigned_long> *)(local_88 + 8),
                                                  local_a0 * 3,(void *)0x0);
                                                  local_60 = local_a0;
                                                  }
                                                  local_70 = local_78 + local_60;
                                                  local_68 = local_70 + local_60;
                                                  local_58 = local_98;
                                                  local_50 = local_90;
                                                  local_4c = local_8c;
                                                  memcpy(local_78,local_b8,local_60 * 0x18);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_88);
                                                  if ((int *)local_88._0_8_ == (int *)0x0) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar12,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if ((int *)local_c8._0_8_ != (int *)0x0) {
                                                      if ((local_60 == local_a0) &&
                                                         (local_58 == local_98)) {
                                                        local_cc = 0;
                                                        piVar4 = andres::marray_detail::
                                                                 AccessOperatorHelper<true>::
                                                                                                                                  
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_88,&local_cc);
                                                  local_cc = 0;
                                                  piVar5 = andres::marray_detail::
                                                           AccessOperatorHelper<true>::
                                                                                                                      
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8,&local_cc);
                                                  if (piVar4 == piVar5) {
                                                    sVar9 = 0;
                                                    bVar3 = true;
                                                    do {
                                                      bVar14 = bVar3;
                                                      sVar10 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_88,sVar9);
                                                  sVar9 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8,sVar9);
                                                  if (sVar10 != sVar9) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar12,"test failed.");
                                                    __cxa_throw(plVar12,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  sVar9 = 1;
                                                  bVar3 = false;
                                                  } while (bVar14);
                                                  if (local_98 != 0) {
                                                    sVar9 = 0;
                                                    do {
                                                      piVar4 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  operator()((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_88,sVar9);
                                                  iVar1 = *piVar4;
                                                  piVar4 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  operator()((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8,sVar9);
                                                  if (iVar1 != *piVar4) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar12,"test failed.");
                                                    __cxa_throw(plVar12,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  sVar9 = sVar9 + 1;
                                                  } while (sVar9 < local_98);
                                                  }
                                                  uVar17 = 0;
                                                  while( true ) {
                                                    sVar9 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8,0);
                                                  if (sVar9 <= uVar17) break;
                                                  uVar15 = 0;
                                                  while( true ) {
                                                    sVar9 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8,1);
                                                  if (sVar9 <= uVar15) break;
                                                  piVar4 = andres::
                                                  View<int,false,std::allocator<unsigned_long>>::
                                                  operator()((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  local_88,uVar17,uVar15);
                                                  iVar1 = *piVar4;
                                                  piVar4 = andres::
                                                  View<int,false,std::allocator<unsigned_long>>::
                                                  operator()((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  local_c8,uVar17,uVar15);
                                                  uVar15 = uVar15 + 1;
                                                  if (iVar1 != *piVar4) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar12,"test failed.");
                                                    __cxa_throw(plVar12,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  }
                                                  uVar17 = uVar17 + 1;
                                                  }
                                                  operator_delete(local_78,local_60 * 0x18);
                                                  operator_delete(local_b8,local_a0 * 0x18);
                                                  operator_delete(_Var8._M_current,0x10);
                                                  _Var8._M_current =
                                                       (unsigned_long *)operator_new(0x10);
                                                  *_Var8._M_current = 6;
                                                  _Var8._M_current[1] = 4;
                                                  local_c8._0_8_ = local_40;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_c8 + 8),_Var8,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var8._M_current + 2),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)local_88);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8);
                                                  local_88._0_8_ = local_c8._0_8_;
                                                  if (local_a0 == 0) {
                                                    local_60 = 0;
                                                    local_78 = (unsigned_long *)0x0;
                                                  }
                                                  else {
                                                    local_78 = __gnu_cxx::
                                                               new_allocator<unsigned_long>::
                                                               allocate((
                                                  new_allocator<unsigned_long> *)(local_88 + 8),
                                                  local_a0 * 3,(void *)0x0);
                                                  local_60 = local_a0;
                                                  }
                                                  local_70 = local_78 + local_60;
                                                  local_68 = local_70 + local_60;
                                                  local_58 = local_98;
                                                  local_50 = local_90;
                                                  local_4c = local_8c;
                                                  memcpy(local_78,local_b8,local_60 * 0x18);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_88);
                                                  if ((int *)local_88._0_8_ == (int *)0x0) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar12,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if ((int *)local_c8._0_8_ != (int *)0x0) {
                                                      if ((local_60 == local_a0) &&
                                                         (local_58 == local_98)) {
                                                        local_cc = 0;
                                                        piVar6 = andres::marray_detail::
                                                                 AccessOperatorHelper<true>::
                                                                                                                                  
                                                  execute<int,int,true,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_88,&local_cc);
                                                  local_cc = 0;
                                                  piVar4 = andres::marray_detail::
                                                           AccessOperatorHelper<true>::
                                                                                                                      
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8,&local_cc);
                                                  if (piVar6 == piVar4) {
                                                    sVar9 = 0;
                                                    bVar3 = true;
                                                    do {
                                                      bVar14 = bVar3;
                                                      sVar10 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_88,sVar9);
                                                  sVar9 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8,sVar9);
                                                  if (sVar10 != sVar9) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar12,"test failed.");
                                                    __cxa_throw(plVar12,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  sVar9 = 1;
                                                  bVar3 = false;
                                                  } while (bVar14);
                                                  if (local_98 != 0) {
                                                    sVar9 = 0;
                                                    do {
                                                      piVar6 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  operator()((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_88,sVar9);
                                                  iVar1 = *piVar6;
                                                  piVar4 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  operator()((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8,sVar9);
                                                  if (iVar1 != *piVar4) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar12,"test failed.");
                                                    __cxa_throw(plVar12,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  sVar9 = sVar9 + 1;
                                                  } while (sVar9 < local_98);
                                                  }
                                                  uVar17 = 0;
                                                  while( true ) {
                                                    sVar9 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8,0);
                                                  if (sVar9 <= uVar17) break;
                                                  uVar15 = 0;
                                                  while( true ) {
                                                    sVar9 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8,1);
                                                  if (sVar9 <= uVar15) break;
                                                  piVar6 = andres::
                                                  View<int,true,std::allocator<unsigned_long>>::
                                                  operator()((
                                                  View<int,true,std::allocator<unsigned_long>> *)
                                                  local_88,uVar17,uVar15);
                                                  iVar1 = *piVar6;
                                                  piVar4 = andres::
                                                  View<int,false,std::allocator<unsigned_long>>::
                                                  operator()((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  local_c8,uVar17,uVar15);
                                                  uVar15 = uVar15 + 1;
                                                  if (iVar1 != *piVar4) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar12,"test failed.");
                                                    __cxa_throw(plVar12,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  }
                                                  uVar17 = uVar17 + 1;
                                                  }
                                                  operator_delete(local_78,local_60 * 0x18);
                                                  operator_delete(local_b8,local_a0 * 0x18);
                                                  operator_delete(_Var8._M_current,0x10);
                                                  _Var8._M_current =
                                                       (unsigned_long *)operator_new(0x10);
                                                  *_Var8._M_current = 6;
                                                  _Var8._M_current[1] = 4;
                                                  local_c8._0_8_ = local_40;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_c8 + 8),_Var8,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var8._M_current + 2),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)local_88);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8);
                                                  local_88._0_8_ = local_c8._0_8_;
                                                  if (local_a0 == 0) {
                                                    local_60 = 0;
                                                    local_78 = (unsigned_long *)0x0;
                                                  }
                                                  else {
                                                    local_78 = __gnu_cxx::
                                                               new_allocator<unsigned_long>::
                                                               allocate((
                                                  new_allocator<unsigned_long> *)(local_88 + 8),
                                                  local_a0 * 3,(void *)0x0);
                                                  local_60 = local_a0;
                                                  }
                                                  local_70 = local_78 + local_60;
                                                  local_68 = local_70 + local_60;
                                                  local_58 = local_98;
                                                  local_50 = local_90;
                                                  local_4c = local_8c;
                                                  memcpy(local_78,local_b8,local_60 * 0x18);
                                                  if ((int *)local_88._0_8_ == (int *)0x0) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar12,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if ((int *)local_c8._0_8_ != (int *)0x0) {
                                                      if ((local_60 == local_a0) &&
                                                         (local_58 == local_98)) {
                                                        local_cc = 0;
                                                        piVar6 = andres::marray_detail::
                                                                 AccessOperatorHelper<true>::
                                                                                                                                  
                                                  execute<int,int,true,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_88,&local_cc);
                                                  local_cc = 0;
                                                  piVar7 = andres::marray_detail::
                                                           AccessOperatorHelper<true>::
                                                                                                                      
                                                  execute<int,int,true,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8,&local_cc);
                                                  if (piVar6 == piVar7) {
                                                    sVar9 = 0;
                                                    bVar3 = true;
                                                    do {
                                                      bVar14 = bVar3;
                                                      sVar10 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_88,sVar9);
                                                  sVar9 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8,sVar9);
                                                  if (sVar10 != sVar9) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar12,"test failed.");
                                                    __cxa_throw(plVar12,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  sVar9 = 1;
                                                  bVar3 = false;
                                                  } while (bVar14);
                                                  if (local_98 != 0) {
                                                    sVar9 = 0;
                                                    do {
                                                      piVar6 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  operator()((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_88,sVar9);
                                                  iVar1 = *piVar6;
                                                  piVar6 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  operator()((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8,sVar9);
                                                  if (iVar1 != *piVar6) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar12,"test failed.");
                                                    __cxa_throw(plVar12,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  sVar9 = sVar9 + 1;
                                                  } while (sVar9 < local_98);
                                                  }
                                                  uVar17 = 0;
                                                  while( true ) {
                                                    sVar9 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8,0);
                                                  if (sVar9 <= uVar17) break;
                                                  uVar15 = 0;
                                                  while( true ) {
                                                    sVar9 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8,1);
                                                  if (sVar9 <= uVar15) break;
                                                  piVar6 = andres::
                                                  View<int,true,std::allocator<unsigned_long>>::
                                                  operator()((
                                                  View<int,true,std::allocator<unsigned_long>> *)
                                                  local_88,uVar17,uVar15);
                                                  iVar1 = *piVar6;
                                                  piVar6 = andres::
                                                  View<int,true,std::allocator<unsigned_long>>::
                                                  operator()((
                                                  View<int,true,std::allocator<unsigned_long>> *)
                                                  local_c8,uVar17,uVar15);
                                                  uVar15 = uVar15 + 1;
                                                  if (iVar1 != *piVar6) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar12,"test failed.");
                                                    __cxa_throw(plVar12,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  }
                                                  uVar17 = uVar17 + 1;
                                                  }
                                                  operator_delete(local_78,local_60 * 0x18);
                                                  operator_delete(local_b8,local_a0 * 0x18);
                                                  operator_delete(_Var8._M_current,0x10);
                                                  local_38 = (unsigned_long *)operator_new(0x18);
                                                  *local_38 = 3;
                                                  local_38[1] = 4;
                                                  local_38[2] = 2;
                                                  local_c8._0_8_ = local_40;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_c8 + 8),
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )local_38,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(local_38 + 3),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)local_88);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8);
                                                  local_88._0_8_ = local_c8._0_8_;
                                                  if (local_a0 == 0) {
                                                    local_60 = 0;
                                                    local_78 = (unsigned_long *)0x0;
                                                  }
                                                  else {
                                                    local_78 = __gnu_cxx::
                                                               new_allocator<unsigned_long>::
                                                               allocate((
                                                  new_allocator<unsigned_long> *)(local_88 + 8),
                                                  local_a0 * 3,(void *)0x0);
                                                  local_60 = local_a0;
                                                  }
                                                  local_70 = local_78 + local_60;
                                                  local_68 = local_70 + local_60;
                                                  local_58 = local_98;
                                                  local_50 = local_90;
                                                  local_4c = local_8c;
                                                  memcpy(local_78,local_b8,local_60 * 0x18);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_88);
                                                  if ((int *)local_88._0_8_ == (int *)0x0) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar12,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if ((int *)local_c8._0_8_ != (int *)0x0) {
                                                      if ((local_60 == local_a0) &&
                                                         (local_58 == local_98)) {
                                                        local_cc = 0;
                                                        piVar4 = andres::marray_detail::
                                                                 AccessOperatorHelper<true>::
                                                                                                                                  
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_88,&local_cc);
                                                  local_cc = 0;
                                                  piVar5 = andres::marray_detail::
                                                           AccessOperatorHelper<true>::
                                                                                                                      
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8,&local_cc);
                                                  if (piVar4 == piVar5) {
                                                    sVar9 = 0;
                                                    do {
                                                      sVar10 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_88,sVar9);
                                                  sVar11 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8,sVar9);
                                                  if (sVar10 != sVar11) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar12,"test failed.");
                                                    __cxa_throw(plVar12,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  sVar9 = sVar9 + 1;
                                                  } while (sVar9 != 3);
                                                  if (local_98 != 0) {
                                                    sVar9 = 0;
                                                    do {
                                                      piVar4 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  operator()((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_88,sVar9);
                                                  iVar1 = *piVar4;
                                                  piVar4 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  operator()((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8,sVar9);
                                                  if (iVar1 != *piVar4) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar12,"test failed.");
                                                    __cxa_throw(plVar12,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  sVar9 = sVar9 + 1;
                                                  } while (sVar9 < local_98);
                                                  }
                                                  local_48 = 0;
                                                  while( true ) {
                                                    sVar9 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8,0);
                                                  if (sVar9 <= local_48) break;
                                                  uVar17 = 0;
                                                  while( true ) {
                                                    sVar9 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8,1);
                                                  if (sVar9 <= uVar17) break;
                                                  uVar15 = 0;
                                                  while( true ) {
                                                    sVar9 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8,2);
                                                  if (sVar9 <= uVar15) break;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8);
                                                  uVar2 = local_c8._0_8_;
                                                  if (((int *)local_c8._0_8_ == (int *)0x0) ||
                                                     (local_a0 != 3)) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar12,
                                                               "Assertion failed.");
LAB_001290c0:
                                                    pcVar13 = std::runtime_error::~runtime_error;
                                                    puVar16 = &std::runtime_error::typeinfo;
                                                    goto LAB_001290ce;
                                                  }
                                                  sVar9 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  strides((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8,0);
                                                  sVar10 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<unsigned_long>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8,3,uVar17,uVar15);
                                                  iVar1 = *(int *)(uVar2 + (sVar9 * local_48 +
                                                                           sVar10) * 4);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_88);
                                                  uVar2 = local_88._0_8_;
                                                  if (((int *)local_88._0_8_ == (int *)0x0) ||
                                                     (local_60 != 3)) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar12,
                                                               "Assertion failed.");
                                                    goto LAB_001290c0;
                                                  }
                                                  sVar9 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  strides((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_88,0);
                                                  sVar10 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<unsigned_long>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_88,3,uVar17,uVar15);
                                                  uVar15 = uVar15 + 1;
                                                  if (iVar1 != *(int *)(uVar2 + (sVar9 * local_48 +
                                                                                sVar10) * 4)) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar12,"test failed.");
                                                    pcVar13 = std::logic_error::~logic_error;
                                                    puVar16 = &std::logic_error::typeinfo;
LAB_001290ce:
                                                    __cxa_throw(plVar12,puVar16,pcVar13);
                                                  }
                                                  }
                                                  uVar17 = uVar17 + 1;
                                                  }
                                                  local_48 = local_48 + 1;
                                                  }
                                                  operator_delete(local_78,local_60 * 0x18);
                                                  operator_delete(local_b8,local_a0 * 0x18);
                                                  operator_delete(local_38,0x18);
                                                  local_38 = (unsigned_long *)operator_new(0x18);
                                                  *local_38 = 3;
                                                  local_38[1] = 4;
                                                  local_38[2] = 2;
                                                  local_c8._0_8_ = local_40;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_c8 + 8),
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )local_38,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(local_38 + 3),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)local_88);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8);
                                                  local_88._0_8_ = local_c8._0_8_;
                                                  if (local_a0 == 0) {
                                                    local_60 = 0;
                                                    local_78 = (unsigned_long *)0x0;
                                                  }
                                                  else {
                                                    local_78 = __gnu_cxx::
                                                               new_allocator<unsigned_long>::
                                                               allocate((
                                                  new_allocator<unsigned_long> *)(local_88 + 8),
                                                  local_a0 * 3,(void *)0x0);
                                                  local_60 = local_a0;
                                                  }
                                                  local_70 = local_78 + local_60;
                                                  local_68 = local_70 + local_60;
                                                  local_58 = local_98;
                                                  local_50 = local_90;
                                                  local_4c = local_8c;
                                                  memcpy(local_78,local_b8,local_60 * 0x18);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_88);
                                                  if ((int *)local_88._0_8_ == (int *)0x0) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar12,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if ((int *)local_c8._0_8_ != (int *)0x0) {
                                                      if ((local_60 == local_a0) &&
                                                         (local_58 == local_98)) {
                                                        local_cc = 0;
                                                        piVar6 = andres::marray_detail::
                                                                 AccessOperatorHelper<true>::
                                                                                                                                  
                                                  execute<int,int,true,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_88,&local_cc);
                                                  local_cc = 0;
                                                  piVar4 = andres::marray_detail::
                                                           AccessOperatorHelper<true>::
                                                                                                                      
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8,&local_cc);
                                                  if (piVar6 == piVar4) {
                                                    sVar9 = 0;
                                                    do {
                                                      sVar10 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_88,sVar9);
                                                  sVar11 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8,sVar9);
                                                  if (sVar10 != sVar11) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar12,"test failed.");
                                                    __cxa_throw(plVar12,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  sVar9 = sVar9 + 1;
                                                  } while (sVar9 != 3);
                                                  if (local_98 != 0) {
                                                    sVar9 = 0;
                                                    do {
                                                      piVar6 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  operator()((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_88,sVar9);
                                                  iVar1 = *piVar6;
                                                  piVar4 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  operator()((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8,sVar9);
                                                  if (iVar1 != *piVar4) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar12,"test failed.");
                                                    __cxa_throw(plVar12,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  sVar9 = sVar9 + 1;
                                                  } while (sVar9 < local_98);
                                                  }
                                                  local_48 = 0;
                                                  while( true ) {
                                                    sVar9 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8,0);
                                                  if (sVar9 <= local_48) break;
                                                  uVar17 = 0;
                                                  while( true ) {
                                                    sVar9 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8,1);
                                                  if (sVar9 <= uVar17) break;
                                                  uVar15 = 0;
                                                  while( true ) {
                                                    sVar9 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8,2);
                                                  if (sVar9 <= uVar15) break;
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8);
                                                  uVar2 = local_c8._0_8_;
                                                  if (((int *)local_c8._0_8_ == (int *)0x0) ||
                                                     (local_a0 != 3)) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar12,
                                                               "Assertion failed.");
LAB_0012913c:
                                                    pcVar13 = std::runtime_error::~runtime_error;
                                                    puVar16 = &std::runtime_error::typeinfo;
                                                    goto LAB_0012914a;
                                                  }
                                                  sVar9 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  strides((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8,0);
                                                  sVar10 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<unsigned_long>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_c8,3,uVar17,uVar15);
                                                  iVar1 = *(int *)(uVar2 + (sVar9 * local_48 +
                                                                           sVar10) * 4);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_88);
                                                  uVar2 = local_88._0_8_;
                                                  if (((int *)local_88._0_8_ == (int *)0x0) ||
                                                     (local_60 != 3)) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar12,
                                                               "Assertion failed.");
                                                    goto LAB_0012913c;
                                                  }
                                                  sVar9 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  strides((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_88,0);
                                                  sVar10 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<unsigned_long>
                                                            ((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_88,3,uVar17,uVar15);
                                                  uVar15 = uVar15 + 1;
                                                  if (iVar1 != *(int *)(uVar2 + (sVar9 * local_48 +
                                                                                sVar10) * 4)) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar12,"test failed.");
                                                    pcVar13 = std::logic_error::~logic_error;
                                                    puVar16 = &std::logic_error::typeinfo;
LAB_0012914a:
                                                    __cxa_throw(plVar12,puVar16,pcVar13);
                                                  }
                                                  }
                                                  uVar17 = uVar17 + 1;
                                                  }
                                                  local_48 = local_48 + 1;
                                                  }
                                                  operator_delete(local_78,local_60 * 0x18);
                                                  operator_delete(local_b8,local_a0 * 0x18);
                                                  operator_delete(local_38,0x18);
                                                  _Var8._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  *_Var8._M_current = 3;
                                                  _Var8._M_current[1] = 4;
                                                  _Var8._M_current[2] = 2;
                                                  local_c8._0_8_ = local_40;
                                                  local_40 = (int *)_Var8._M_current;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_c8 + 8),_Var8,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var8._M_current + 3),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)local_88);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8);
                                                  local_88._0_8_ = local_c8._0_8_;
                                                  if (local_a0 == 0) {
                                                    local_60 = 0;
                                                    local_78 = (unsigned_long *)0x0;
                                                  }
                                                  else {
                                                    local_78 = __gnu_cxx::
                                                               new_allocator<unsigned_long>::
                                                               allocate((
                                                  new_allocator<unsigned_long> *)(local_88 + 8),
                                                  local_a0 * 3,(void *)0x0);
                                                  local_60 = local_a0;
                                                  }
                                                  local_70 = local_78 + local_60;
                                                  local_68 = local_70 + local_60;
                                                  local_58 = local_98;
                                                  local_50 = local_90;
                                                  local_4c = local_8c;
                                                  memcpy(local_78,local_b8,local_60 * 0x18);
                                                  if ((int *)local_88._0_8_ == (int *)0x0) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar12,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if ((int *)local_c8._0_8_ != (int *)0x0) {
                                                      if ((local_60 == local_a0) &&
                                                         (local_58 == local_98)) {
                                                        local_cc = 0;
                                                        piVar6 = andres::marray_detail::
                                                                 AccessOperatorHelper<true>::
                                                                                                                                  
                                                  execute<int,int,true,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_88,&local_cc);
                                                  local_cc = 0;
                                                  piVar7 = andres::marray_detail::
                                                           AccessOperatorHelper<true>::
                                                                                                                      
                                                  execute<int,int,true,std::allocator<unsigned_long>>
                                                            ((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8,&local_cc);
                                                  if (piVar6 == piVar7) {
                                                    sVar9 = 0;
                                                    do {
                                                      sVar10 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_88,sVar9);
                                                  sVar11 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8,sVar9);
                                                  if (sVar10 != sVar11) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar12,"test failed.");
                                                    __cxa_throw(plVar12,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  sVar9 = sVar9 + 1;
                                                  } while (sVar9 != 3);
                                                  if (local_98 != 0) {
                                                    sVar9 = 0;
                                                    do {
                                                      piVar6 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  operator()((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_88,sVar9);
                                                  iVar1 = *piVar6;
                                                  piVar6 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  operator()((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8,sVar9);
                                                  if (iVar1 != *piVar6) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar12,"test failed.");
                                                    __cxa_throw(plVar12,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  sVar9 = sVar9 + 1;
                                                  } while (sVar9 < local_98);
                                                  }
                                                  local_48 = 0;
                                                  do {
                                                    sVar9 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8,0);
                                                  if (sVar9 <= local_48) {
                                                    operator_delete(local_78,local_60 * 0x18);
                                                    operator_delete(local_b8,local_a0 * 0x18);
                                                    operator_delete(local_40,0x18);
                                                    return;
                                                  }
                                                  uVar17 = 0;
                                                  while( true ) {
                                                    sVar9 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8,1);
                                                  if (sVar9 <= uVar17) break;
                                                  uVar15 = 0;
                                                  while( true ) {
                                                    sVar9 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  shape((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8,2);
                                                  if (sVar9 <= uVar15) break;
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8);
                                                  uVar2 = local_c8._0_8_;
                                                  if (((int *)local_c8._0_8_ == (int *)0x0) ||
                                                     (local_a0 != 3)) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar12,
                                                               "Assertion failed.");
LAB_001291b8:
                                                    pcVar13 = std::runtime_error::~runtime_error;
                                                    puVar16 = &std::runtime_error::typeinfo;
                                                    goto LAB_001291c6;
                                                  }
                                                  sVar9 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  strides((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8,0);
                                                  sVar10 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<unsigned_long>
                                                            ((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_c8,3,uVar17,uVar15);
                                                  iVar1 = *(int *)(uVar2 + (sVar9 * local_48 +
                                                                           sVar10) * 4);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_88);
                                                  uVar2 = local_88._0_8_;
                                                  if (((int *)local_88._0_8_ == (int *)0x0) ||
                                                     (local_60 != 3)) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar12,
                                                               "Assertion failed.");
                                                    goto LAB_001291b8;
                                                  }
                                                  sVar9 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  strides((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_88,0);
                                                  sVar10 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<unsigned_long>
                                                            ((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_88,3,uVar17,uVar15);
                                                  uVar15 = uVar15 + 1;
                                                  if (iVar1 != *(int *)(uVar2 + (sVar9 * local_48 +
                                                                                sVar10) * 4)) {
                                                    plVar12 = (logic_error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar12,"test failed.");
                                                    pcVar13 = std::logic_error::~logic_error;
                                                    puVar16 = &std::logic_error::typeinfo;
LAB_001291c6:
                                                    __cxa_throw(plVar12,puVar16,pcVar13);
                                                  }
                                                  }
                                                  uVar17 = uVar17 + 1;
                                                  }
                                                  local_48 = local_48 + 1;
                                                  } while( true );
                                                  }
                                                  }
                                                  plVar12 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar12,"test failed.");
                                                  pcVar13 = std::logic_error::~logic_error;
                                                  puVar16 = &std::logic_error::typeinfo;
                                                  goto LAB_00129bd4;
                                                  }
                                                  plVar12 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar12,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar13 = std::runtime_error::~runtime_error;
                                                  puVar16 = &std::runtime_error::typeinfo;
LAB_00129bd4:
                                                  __cxa_throw(plVar12,puVar16,pcVar13);
                                                  }
                                                  }
                                                  plVar12 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar12,"test failed.");
                                                  pcVar13 = std::logic_error::~logic_error;
                                                  puVar16 = &std::logic_error::typeinfo;
                                                  goto LAB_00129b84;
                                                  }
                                                  plVar12 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar12,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar13 = std::runtime_error::~runtime_error;
                                                  puVar16 = &std::runtime_error::typeinfo;
LAB_00129b84:
                                                  __cxa_throw(plVar12,puVar16,pcVar13);
                                                  }
                                                  }
                                                  plVar12 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar12,"test failed.");
                                                  pcVar13 = std::logic_error::~logic_error;
                                                  puVar16 = &std::logic_error::typeinfo;
                                                  goto LAB_00129b34;
                                                  }
                                                  plVar12 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar12,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar13 = std::runtime_error::~runtime_error;
                                                  puVar16 = &std::runtime_error::typeinfo;
LAB_00129b34:
                                                  __cxa_throw(plVar12,puVar16,pcVar13);
                                                  }
                                                  }
                                                  plVar12 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar12,"test failed.");
                                                  pcVar13 = std::logic_error::~logic_error;
                                                  puVar16 = &std::logic_error::typeinfo;
                                                  goto LAB_00129ae4;
                                                  }
                                                  plVar12 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar12,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar13 = std::runtime_error::~runtime_error;
                                                  puVar16 = &std::runtime_error::typeinfo;
LAB_00129ae4:
                                                  __cxa_throw(plVar12,puVar16,pcVar13);
                                                  }
                                                  }
                                                  plVar12 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar12,"test failed.");
                                                  pcVar13 = std::logic_error::~logic_error;
                                                  puVar16 = &std::logic_error::typeinfo;
                                                  goto LAB_00129a94;
                                                  }
                                                  plVar12 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar12,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar13 = std::runtime_error::~runtime_error;
                                                  puVar16 = &std::runtime_error::typeinfo;
LAB_00129a94:
                                                  __cxa_throw(plVar12,puVar16,pcVar13);
                                                  }
                                                  }
                                                  plVar12 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar12,"test failed.");
                                                  pcVar13 = std::logic_error::~logic_error;
                                                  puVar16 = &std::logic_error::typeinfo;
                                                  goto LAB_00129a44;
                                                  }
                                                  plVar12 = (logic_error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar12,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar13 = std::runtime_error::~runtime_error;
                                                  puVar16 = &std::runtime_error::typeinfo;
LAB_00129a44:
                                                  __cxa_throw(plVar12,puVar16,pcVar13);
                                                }
                                              }
                                              plVar12 = (logic_error *)
                                                        __cxa_allocate_exception(0x10);
                                              std::logic_error::logic_error(plVar12,"test failed.");
                                              pcVar13 = std::logic_error::~logic_error;
                                              puVar16 = &std::logic_error::typeinfo;
                                              goto LAB_001299c2;
                                            }
                                            plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                                            std::runtime_error::runtime_error
                                                      ((runtime_error *)plVar12,"Assertion failed.")
                                            ;
                                          }
                                          pcVar13 = std::runtime_error::~runtime_error;
                                          puVar16 = &std::runtime_error::typeinfo;
LAB_001299c2:
                                          __cxa_throw(plVar12,puVar16,pcVar13);
                                        }
                                      }
                                      plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                                      std::logic_error::logic_error(plVar12,"test failed.");
                                      pcVar13 = std::logic_error::~logic_error;
                                      puVar16 = &std::logic_error::typeinfo;
                                      goto LAB_00129940;
                                    }
                                    plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                                    std::runtime_error::runtime_error
                                              ((runtime_error *)plVar12,"Assertion failed.");
                                  }
                                  pcVar13 = std::runtime_error::~runtime_error;
                                  puVar16 = &std::runtime_error::typeinfo;
LAB_00129940:
                                  __cxa_throw(plVar12,puVar16,pcVar13);
                                }
                              }
                              plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                              std::logic_error::logic_error(plVar12,"test failed.");
                              pcVar13 = std::logic_error::~logic_error;
                              puVar16 = &std::logic_error::typeinfo;
                              goto LAB_001298be;
                            }
                            plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                            std::runtime_error::runtime_error
                                      ((runtime_error *)plVar12,"Assertion failed.");
                          }
                          pcVar13 = std::runtime_error::~runtime_error;
                          puVar16 = &std::runtime_error::typeinfo;
LAB_001298be:
                          __cxa_throw(plVar12,puVar16,pcVar13);
                        }
                      }
                      plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                      std::logic_error::logic_error(plVar12,"test failed.");
                      pcVar13 = std::logic_error::~logic_error;
                      puVar16 = &std::logic_error::typeinfo;
                      goto LAB_0012986e;
                    }
                    plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error((runtime_error *)plVar12,"Assertion failed.");
                  }
                  pcVar13 = std::runtime_error::~runtime_error;
                  puVar16 = &std::runtime_error::typeinfo;
LAB_0012986e:
                  __cxa_throw(plVar12,puVar16,pcVar13);
                }
              }
              plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
              std::logic_error::logic_error(plVar12,"test failed.");
              pcVar13 = std::logic_error::~logic_error;
              puVar16 = &std::logic_error::typeinfo;
              goto LAB_0012981e;
            }
            plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error((runtime_error *)plVar12,"Assertion failed.");
          }
          pcVar13 = std::runtime_error::~runtime_error;
          puVar16 = &std::runtime_error::typeinfo;
LAB_0012981e:
          __cxa_throw(plVar12,puVar16,pcVar13);
        }
      }
      plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar12,"test failed.");
      pcVar13 = std::logic_error::~logic_error;
      puVar16 = &std::logic_error::typeinfo;
      goto LAB_001297ce;
    }
    plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar12,"Assertion failed.");
  }
  pcVar13 = std::runtime_error::~runtime_error;
  puVar16 = &std::runtime_error::typeinfo;
LAB_001297ce:
  __cxa_throw(plVar12,puVar16,pcVar13);
}

Assistant:

void ViewTest::copyConstructorTest() {
    // scalar 
    {
        // false, false
        {
            andres::View<int, false> v(&scalar_);
            andres::View<int, false> w(v);

            test(w.dimension() == v.dimension() &&
                   w.size() == v.size() &&
                   &(w(0)) == &(v(0)));
        }
        // false, true
        {
            andres::View<int, false> v(&scalar_);
            andres::View<int, true> w(v);

            test(w.dimension() == v.dimension() &&
                   w.size() == v.size() &&
                   &(w(0)) == &(v(0)));
        }
        // true, true
        {
            andres::View<int, true> v(&scalar_);
            andres::View<int, true> w(v);

            test(w.dimension() == v.dimension() &&
                   w.size() == v.size() &&
                   &(w(0)) == &(v(0)));
        }
    }
    // 1D 
    {
        // false, false
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24;
            andres::View<int, false> v(shape.begin(), shape.end(), data_);
            andres::View<int, false> w(v);

            test(w.dimension() == v.dimension() &&
                   w.size() == v.size() &&
                   &(w(0)) == &(v(0))
            );
            for(unsigned short j=0; j<shape.size(); ++j) {
                test(w.shape(j) == v.shape(j));
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(w(j) == v(j));
            }
        }
        // false, true
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24;
            andres::View<int, false> v(shape.begin(), shape.end(), data_);
            andres::View<int, true> w(v);

            test(w.dimension() == v.dimension() &&
                   w.size() == v.size() &&
                   &(w(0)) == &(v(0))
            );
            for(unsigned short j=0; j<shape.size(); ++j) {
                test(w.shape(j) == v.shape(j));
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(w(j) == v(j));
            }
        }
        // true, true
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24;
            andres::View<int, true> v(shape.begin(), shape.end(), data_);
            andres::View<int, true> w(v);

            test(w.dimension() == v.dimension() &&
                   w.size() == v.size() &&
                   &(w(0)) == &(v(0))
            );
            for(unsigned short j=0; j<shape.size(); ++j) {
                test(w.shape(j) == v.shape(j));
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(w(j) == v(j));
            }
        }
    }
    // 2D 
    {
        // false, false
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 6;
            shape[1] = 4;
            andres::View<int> v(shape.begin(), shape.end(), data_);
            andres::View<int> w(v);

            test(w.dimension() == v.dimension() &&
                   w.size() == v.size() &&
                   &(w(0)) == &(v(0))
            );
            for(unsigned short j=0; j<shape.size(); ++j) {
                test(w.shape(j) == v.shape(j));
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(w(j) == v(j));
            }
            for(std::size_t j=0; j<v.shape(0); ++j) {
                for(std::size_t k=0; k<v.shape(1); ++k) {
                    test(w(j, k) == v(j, k));
                }
            }
        }
        // false, true
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 6;
            shape[1] = 4;
            andres::View<int, false> v(shape.begin(), shape.end(), data_);
            andres::View<int, true> w(v);

            test(w.dimension() == v.dimension() &&
                   w.size() == v.size() &&
                   &(w(0)) == &(v(0))
            );
            for(unsigned short j=0; j<shape.size(); ++j) {
                test(w.shape(j) == v.shape(j));
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(w(j) == v(j));
            }
            for(std::size_t j=0; j<v.shape(0); ++j) {
                for(std::size_t k=0; k<v.shape(1); ++k) {
                    test(w(j, k) == v(j, k));
                }
            }
        }
        // true, true
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 6;
            shape[1] = 4;
            andres::View<int, true> v(shape.begin(), shape.end(), data_);
            andres::View<int, true> w(v);
            
            test(w.dimension() == v.dimension() &&
                   w.size() == v.size() &&
                   &(w(0)) == &(v(0))
            );
            for(unsigned short j=0; j<shape.size(); ++j) {
                test(w.shape(j) == v.shape(j));
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(w(j) == v(j));
            }
            for(std::size_t j=0; j<v.shape(0); ++j) {
                for(std::size_t k=0; k<v.shape(1); ++k) {
                    test(w(j, k) == v(j, k));
                }
            }
        }
    }
    // 3D 
    {
        // false, false
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, false> v(shape.begin(), shape.end(), data_);
            andres::View<int, false> w(v);
            
            test(w.dimension() == v.dimension() &&
                   w.size() == v.size() &&
                   &(w(0)) == &(v(0))
            );
            for(unsigned short j=0; j<shape.size(); ++j) {
                test(w.shape(j) == v.shape(j));
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(w(j) == v(j));
            }
            for(std::size_t j=0; j<v.shape(0); ++j) {
                for(std::size_t k=0; k<v.shape(1); ++k) {
                    for(std::size_t p=0; p<v.shape(2); ++p) {
                        test(v(j, k, p) == w(j, k, p));
                    }
                }
            }
        }
        // false, true
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, false> v(shape.begin(), shape.end(), data_);
            andres::View<int, true> w(v);
            
            test(w.dimension() == v.dimension() &&
                   w.size() == v.size() &&
                   &(w(0)) == &(v(0))
            );
            for(unsigned short j=0; j<shape.size(); ++j) {
                test(w.shape(j) == v.shape(j));
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(w(j) == v(j));
            }
            for(std::size_t j=0; j<v.shape(0); ++j) {
                for(std::size_t k=0; k<v.shape(1); ++k) {
                    for(std::size_t p=0; p<v.shape(2); ++p) {
                        test(v(j, k, p) == w(j, k, p));
                    }
                }
            }
        }
        // true, true
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, true> v(shape.begin(), shape.end(), data_);
            andres::View<int, true> w(v);
            
            test(w.dimension() == v.dimension() &&
                   w.size() == v.size() &&
                   &(w(0)) == &(v(0))
            );
            for(unsigned short j=0; j<shape.size(); ++j) {
                test(w.shape(j) == v.shape(j));
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(w(j) == v(j));
            }
            for(std::size_t j=0; j<v.shape(0); ++j) {
                for(std::size_t k=0; k<v.shape(1); ++k) {
                    for(std::size_t p=0; p<v.shape(2); ++p) {
                        test(v(j, k, p) == w(j, k, p));
                    }
                }
            }
        }
    }
}